

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O3

void __thiscall Dependency::Dependency(Dependency *this,string *path,string *dependent_file)

{
  string *prefix;
  size_type sVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  ostream *poVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar8;
  uint uVar9;
  Settings *this_00;
  undefined1 *puVar10;
  char *pcVar11;
  string search_path;
  string original_file;
  char original_file_buffer [4096];
  string local_10d8;
  undefined1 *local_10b8;
  char *local_10b0;
  undefined1 local_10a8 [16];
  string *local_1098;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1090;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1088;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1080;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1078;
  undefined1 *local_1058 [2];
  undefined1 local_1048 [16];
  char local_1038 [4104];
  
  local_1080 = &(this->filename).field_2;
  (this->filename)._M_dataplus._M_p = (pointer)local_1080;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  prefix = &this->prefix;
  local_1088 = &(this->prefix).field_2;
  (this->prefix)._M_dataplus._M_p = (pointer)local_1088;
  (this->prefix)._M_string_length = 0;
  (this->prefix).field_2._M_local_buf[0] = '\0';
  (this->symlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->symlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->symlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1098 = (string *)&this->new_name;
  local_1090 = &(this->new_name).field_2;
  (this->new_name)._M_dataplus._M_p = (pointer)local_1090;
  (this->new_name)._M_string_length = 0;
  (this->new_name).field_2._M_local_buf[0] = '\0';
  local_10b8 = local_10a8;
  local_10b0 = (char *)0x0;
  local_10a8[0] = 0;
  rtrim(path);
  bVar2 = isRpath(path);
  if (bVar2) {
    searchFilenameInRpaths(&local_10d8,path,dependent_file);
    std::__cxx11::string::operator=((string *)&local_10b8,(string *)&local_10d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_10d8._M_dataplus._M_p != &local_10d8.field_2) {
      operator_delete(local_10d8._M_dataplus._M_p);
    }
  }
  else {
    rtrim(path);
    pcVar5 = realpath((path->_M_dataplus)._M_p,local_1038);
    pcVar11 = local_10b0;
    if (pcVar5 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\n/!\\ WARNING : Cannot resolve path \'",0x24);
      pcVar11 = (path->_M_dataplus)._M_p;
      if (pcVar11 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x128378);
      }
      else {
        sVar6 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'",1);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      std::__cxx11::string::_M_assign((string *)&local_10b8);
    }
    else {
      strlen(local_1038);
      std::__cxx11::string::_M_replace((ulong)&local_10b8,0,pcVar11,(ulong)local_1038);
    }
  }
  pcVar11 = local_10b0;
  puVar10 = local_10b8;
  if (local_10b0 == (char *)path->_M_string_length) {
    if (local_10b0 == (char *)0x0) {
      pcVar11 = (char *)0x0;
    }
    else {
      iVar3 = bcmp(local_10b8,(path->_M_dataplus)._M_p,(size_t)local_10b0);
      if (iVar3 != 0) goto LAB_00106205;
    }
  }
  else {
LAB_00106205:
    addSymlink(this,path);
    puVar10 = local_10b8;
    pcVar11 = local_10b0;
  }
  local_1058[0] = local_1048;
  std::__cxx11::string::_M_construct<char*>((string *)local_1058,puVar10,pcVar11 + (long)puVar10);
  std::__cxx11::string::rfind((char *)local_1058,0x11d7fd,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&local_10d8,(ulong)local_1058);
  std::__cxx11::string::operator=((string *)this,(string *)&local_10d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10d8._M_dataplus._M_p != &local_10d8.field_2) {
    operator_delete(local_10d8._M_dataplus._M_p);
  }
  if (local_1058[0] != local_1048) {
    operator_delete(local_1058[0]);
  }
  std::__cxx11::string::rfind((char *)&local_10b8,0x11d7fd,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&local_10d8,(ulong)&local_10b8);
  std::__cxx11::string::operator=((string *)prefix,(string *)&local_10d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10d8._M_dataplus._M_p != &local_10d8.field_2) {
    operator_delete(local_10d8._M_dataplus._M_p);
  }
  sVar1 = (this->prefix)._M_string_length;
  if ((sVar1 != 0) && ((prefix->_M_dataplus)._M_p[sVar1 - 1] != '/')) {
    std::__cxx11::string::append((char *)prefix);
  }
  bVar2 = Settings::isPrefixBundled(prefix);
  if (!bVar2) goto LAB_001065b5;
  if ((this->prefix)._M_string_length == 0) {
LAB_00106384:
    uVar4 = Settings::searchPathAmount();
    uVar8 = extraout_RDX;
    if (uVar4 == 0) {
      initSearchPaths();
      uVar4 = Settings::searchPathAmount();
      uVar8 = extraout_RDX_00;
    }
    if (0 < (int)uVar4) {
      this_00 = (Settings *)0x0;
      do {
        Settings::searchPath_abi_cxx11_(&local_10d8,this_00,(int)uVar8);
        std::operator+(&local_1078,&local_10d8,&this->filename);
        bVar2 = fileExists(&local_1078);
        uVar8 = extraout_RDX_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1078._M_dataplus._M_p != &local_1078.field_2) {
          operator_delete(local_1078._M_dataplus._M_p);
          uVar8 = extraout_RDX_02;
        }
        if (bVar2) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FOUND ",6);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(this->filename)._M_dataplus._M_p,
                              (this->filename)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," in ",4);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_10d8._M_dataplus._M_p,local_10d8._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          std::__cxx11::string::_M_assign((string *)prefix);
          missing_prefixes = true;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_10d8._M_dataplus._M_p != &local_10d8.field_2) {
            operator_delete(local_10d8._M_dataplus._M_p);
          }
          break;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_10d8._M_dataplus._M_p != &local_10d8.field_2) {
          operator_delete(local_10d8._M_dataplus._M_p);
          uVar8 = extraout_RDX_03;
        }
        uVar9 = (int)this_00 + 1;
        this_00 = (Settings *)(ulong)uVar9;
      } while (uVar4 != uVar9);
    }
  }
  else {
    std::operator+(&local_10d8,prefix,&this->filename);
    bVar2 = fileExists(&local_10d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_10d8._M_dataplus._M_p != &local_10d8.field_2) {
      operator_delete(local_10d8._M_dataplus._M_p);
    }
    if (!bVar2) goto LAB_00106384;
  }
  bVar2 = Settings::isPrefixIgnored(prefix);
  if (!bVar2) {
    if ((this->prefix)._M_string_length != 0) {
      std::operator+(&local_10d8,prefix,&this->filename);
      bVar2 = fileExists(&local_10d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10d8._M_dataplus._M_p != &local_10d8.field_2) {
        operator_delete(local_10d8._M_dataplus._M_p);
      }
      if (bVar2) goto LAB_001065a8;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\n/!\\ WARNING : Library ",0x17);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->filename)._M_dataplus._M_p,
                        (this->filename)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," has an incomplete name (location unknown)",0x2a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    missing_prefixes = true;
    getUserInputDirForFile(&local_10d8,&this->filename);
    Settings::addSearchPath(&local_10d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_10d8._M_dataplus._M_p != &local_10d8.field_2) {
      operator_delete(local_10d8._M_dataplus._M_p);
    }
  }
LAB_001065a8:
  std::__cxx11::string::_M_assign(local_1098);
LAB_001065b5:
  if (local_10b8 != local_10a8) {
    operator_delete(local_10b8);
  }
  return;
}

Assistant:

Dependency::Dependency(std::string path, const std::string& dependent_file)
{
    char original_file_buffer[PATH_MAX];
    std::string original_file;

    rtrim(path);
    if (isRpath(path))
    {
        original_file = searchFilenameInRpaths(path, dependent_file);
    }
    else if (realpath(rtrim(path).c_str(), original_file_buffer))
    {
        original_file = original_file_buffer;
    }
    else
    {
        std::cerr << "\n/!\\ WARNING : Cannot resolve path '" << path.c_str() << "'" << std::endl;
        original_file = path;
    }

    // check if given path is a symlink
    if (original_file != path) addSymlink(path);

    filename = stripPrefix(original_file);
    prefix = original_file.substr(0, original_file.rfind("/")+1);
    
    if( !prefix.empty() && prefix[ prefix.size()-1 ] != '/' ) prefix += "/";

    // check if this dependency is in /usr/lib, /System/Library, or in ignored list
    if (!Settings::isPrefixBundled(prefix)) return;

    // check if the lib is in a known location
    if( prefix.empty() || !fileExists( prefix+filename ) )
    {
        //the paths contains at least /usr/lib so if it is empty we have not initialized it
        int searchPathAmount = Settings::searchPathAmount();
        if( searchPathAmount == 0 )
        {
            initSearchPaths();
            searchPathAmount = Settings::searchPathAmount();
        }
        
        //check if file is contained in one of the paths
        for( int i=0; i<searchPathAmount; ++i)
        {
            std::string search_path = Settings::searchPath(i);
            if (fileExists( search_path+filename ))
            {
                std::cout << "FOUND " << filename << " in " << search_path << std::endl;
                prefix = search_path;
                missing_prefixes = true; //the prefix was missing
                break;
            }
        }
    }
    
    //If the location is still unknown, ask the user for search path
    if( !Settings::isPrefixIgnored(prefix)
        && ( prefix.empty() || !fileExists( prefix+filename ) ) )
    {
        std::cerr << "\n/!\\ WARNING : Library " << filename << " has an incomplete name (location unknown)" << std::endl;
        missing_prefixes = true;

        Settings::addSearchPath(getUserInputDirForFile(filename));
    }

    new_name = filename;
}